

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_inst.cpp
# Opt level: O0

bool spvExtInstIsNonSemantic(spv_ext_inst_type_t type)

{
  undefined1 local_9;
  spv_ext_inst_type_t type_local;
  
  if ((((type == SPV_EXT_INST_TYPE_NONSEMANTIC_UNKNOWN) ||
       (type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100)) ||
      (type == SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION)) ||
     (type == SPV_EXT_INST_TYPE_NONSEMANTIC_VKSPREFLECTION)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool spvExtInstIsNonSemantic(const spv_ext_inst_type_t type) {
  if (type == SPV_EXT_INST_TYPE_NONSEMANTIC_UNKNOWN ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100 ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_CLSPVREFLECTION ||
      type == SPV_EXT_INST_TYPE_NONSEMANTIC_VKSPREFLECTION) {
    return true;
  }
  return false;
}